

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O1

CborError create_container(CborEncoder *encoder,CborEncoder *container,size_t length,
                          uint8_t shiftedMajorType)

{
  ulong uVar1;
  CborError CVar2;
  char cVar3;
  byte bVar4;
  uint8_t *puVar5;
  long lVar6;
  void *__src;
  uint8_t *puVar7;
  undefined8 local_20;
  uint8_t auStack_18 [8];
  
  container->data = encoder->data;
  puVar5 = encoder->end;
  container->end = puVar5;
  encoder->added = encoder->added + 1;
  container->added = 0;
  container->flags = shiftedMajorType & 0x20;
  if (length == 0xffffffffffffffff) {
    container->flags = shiftedMajorType & 0x20 | 4;
    if ((long)(container->data).ptr - (long)puVar5 < 0) {
      *(container->data).ptr = shiftedMajorType + '\x1f';
      puVar5 = (uint8_t *)((container->data).bytes_needed + 1);
      CVar2 = CborNoError;
    }
    else {
      if (puVar5 == (uint8_t *)0x0) {
        puVar5 = (uint8_t *)0x1;
      }
      else {
        puVar5 = (container->data).ptr + (1 - (long)puVar5);
        (container->data).ptr = (uint8_t *)0x0;
        container->end = (uint8_t *)0x0;
      }
      puVar5 = (container->data).ptr + (long)puVar5;
      CVar2 = CborErrorOutOfMemory;
    }
    (container->data).ptr = puVar5;
  }
  else {
    __src = (void *)((long)&local_20 + 7);
    uVar1 = length >> 0x38 | (length & 0xff000000000000) >> 0x28 | (length & 0xff0000000000) >> 0x18
            | (length & 0xff00000000) >> 8 | (length & 0xff000000) << 8 |
            (length & 0xff0000) << 0x18 | (length & 0xff00) << 0x28;
    local_20 = uVar1 | length << 0x38;
    if (length < 0x18) {
      local_20._7_1_ = (char)length;
      local_20 = CONCAT17(local_20._7_1_ + shiftedMajorType,(int7)uVar1);
    }
    else {
      cVar3 = '\x02';
      if (length < 0x10000) {
        cVar3 = 0xff < length;
      }
      bVar4 = (cVar3 + '\x01') - (length >> 0x20 == 0);
      lVar6 = -1L << (bVar4 & 0x3f);
      __src = (void *)((long)__src + lVar6);
      auStack_18[lVar6 + -1] = bVar4 + shiftedMajorType + '\x18';
    }
    puVar7 = auStack_18 + -(long)__src;
    if ((long)puVar5 - (long)((container->data).ptr + (long)puVar7) < 0) {
      if (puVar5 != (uint8_t *)0x0) {
        puVar7 = (container->data).ptr + ((long)puVar7 - (long)puVar5);
        (container->data).ptr = (uint8_t *)0x0;
        container->end = (uint8_t *)0x0;
      }
      puVar7 = puVar7 + (long)(container->data).ptr;
      CVar2 = CborErrorOutOfMemory;
    }
    else {
      memcpy((container->data).ptr,__src,(size_t)puVar7);
      puVar7 = puVar7 + (long)(container->data).ptr;
      CVar2 = CborNoError;
    }
    (container->data).ptr = puVar7;
  }
  return CVar2;
}

Assistant:

__attribute__((noinline))
#endif
static CborError create_container(CborEncoder *encoder, CborEncoder *container, size_t length, uint8_t shiftedMajorType)
{
    CborError err;
    container->data.ptr = encoder->data.ptr;
    container->end = encoder->end;
    ++encoder->added;
    container->added = 0;

    cbor_static_assert(((MapType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == CborIteratorFlag_ContainerIsMap);
    cbor_static_assert(((ArrayType << MajorTypeShift) & CborIteratorFlag_ContainerIsMap) == 0);
    container->flags = shiftedMajorType & CborIteratorFlag_ContainerIsMap;

    if (length == CborIndefiniteLength) {
        container->flags |= CborIteratorFlag_UnknownLength;
        err = append_byte_to_buffer(container, shiftedMajorType + IndefiniteLength);
    } else {
        err = encode_number_no_update(container, length, shiftedMajorType);
    }
    return err;
}